

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O1

int Gia_ManQuantVerify_rec(Gia_Man_t *p,int iObj,int CiId)

{
  Gia_Obj_t *pGVar1;
  undefined8 uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  
  uVar6 = (ulong)(uint)iObj;
  while( true ) {
    iVar5 = (int)uVar6;
    if (p->nTravIdsAlloc <= iVar5) {
      __assert_fail("Id < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x268,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
    }
    if (p->pTravIds[iVar5] == p->nTravIds) {
      return 0;
    }
    p->pTravIds[iVar5] = p->nTravIds;
    if ((iVar5 < 0) || (p->nObjs <= iVar5)) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pGVar1 = p->pObjs;
    uVar2 = *(undefined8 *)(pGVar1 + uVar6);
    uVar4 = (uint)uVar2;
    if ((~uVar4 & 0x9fffffff) == 0) {
      return (uint)(((uint)((ulong)uVar2 >> 0x20) & 0x1fffffff) == CiId);
    }
    iVar3 = Gia_ManQuantVerify_rec(p,iVar5 - (uVar4 & 0x1fffffff),CiId);
    if (iVar3 != 0) break;
    uVar6 = (ulong)(iVar5 - (*(uint *)&pGVar1[uVar6].field_0x4 & 0x1fffffff));
  }
  return 1;
}

Assistant:

int Gia_ManQuantVerify_rec( Gia_Man_t * p, int iObj, int CiId )
{
    Gia_Obj_t * pObj;
    if ( Gia_ObjIsTravIdCurrentId( p, iObj ) )
        return 0;
    Gia_ObjSetTravIdCurrentId( p, iObj );
    pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsCi(pObj) )
        return Gia_ObjCioId(pObj) == CiId;
    return Gia_ManQuantVerify_rec( p, Gia_ObjFaninId0(pObj, iObj), CiId ) ||
           Gia_ManQuantVerify_rec( p, Gia_ObjFaninId1(pObj, iObj), CiId );
}